

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::anon_unknown_26::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  ostream *poVar1;
  ColourGuard local_20;
  
  if ((this->result->m_info).capturedExpression.m_size != 0) {
    std::operator<<(this->stream,';');
    poVar1 = this->stream;
    local_20.m_colourImpl = this->colourImpl;
    local_20.m_code = FileName;
    local_20.m_engaged = true;
    (*(local_20.m_colourImpl)->_vptr_ColourImpl[2])(local_20.m_colourImpl,0x17);
    std::operator<<(poVar1," expression was:");
    ColourImpl::ColourGuard::~ColourGuard(&local_20);
    printOriginalExpression(this);
    return;
  }
  return;
}

Assistant:

void printExpressionWas() {
        if (result.hasExpression()) {
            stream << ';';
            {
                stream << colourImpl->guardColour(compactDimColour) << " expression was:";
            }
            printOriginalExpression();
        }
    }